

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O3

double __thiscall S2::GetArea(S2 *this,S2PointLoopSpan loop)

{
  double dVar1;
  S2PointLoopSpan loop_00;
  S2LogMessage SStack_18;
  
  loop_00.super_S2PointSpan.len_ = loop.super_S2PointSpan.ptr_;
  loop_00.super_S2PointSpan.ptr_ = (pointer)this;
  dVar1 = GetSignedArea(loop_00);
  if (ABS(dVar1) <= 6.283185307179586) {
    return (double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                   (ulong)(dVar1 + 12.566370614359172) & -(ulong)(dVar1 < 0.0));
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
             ,0x31,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: (fabs(area)) <= (2 * 3.14159265358979323846) ",0x3b);
  abort();
}

Assistant:

double GetArea(S2PointLoopSpan loop) {
  double area = GetSignedArea(loop);
  S2_DCHECK_LE(fabs(area), 2 * M_PI);
  if (area < 0.0) area += 4 * M_PI;
  return area;
}